

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O2

void __thiscall
sparse_parameters::set_default<std::pair<float,float>,GD::set_initial_gd_wrapper<sparse_parameters>>
          (sparse_parameters *this,pair<float,_float> *info)

{
  float *pfVar1;
  pair<float,_float> *ppVar2;
  
  ppVar2 = calloc_or_throw<std::pair<float,float>>();
  ppVar2->first = info->first;
  ppVar2->second = info->second;
  this->default_data = ppVar2;
  this->fun = GD::set_initial_gd_wrapper<sparse_parameters>::func;
  pfVar1 = this->default_value;
  *pfVar1 = ppVar2->first;
  pfVar1[1] = ppVar2->second;
  return;
}

Assistant:

void set_default(R& info)
  {
    R& new_R = calloc_or_throw<R>();
    new_R = info;
    default_data = &new_R;
    fun = (void (*)(const weight*, void*))T::func;
    fun(default_value, default_data);
  }